

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O3

IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
* __thiscall
linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
Intersect<linq::IEnumerable<int>&>
          (IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
           *__return_storage_ptr__,
          IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *this,
          IEnumerable<int> *other)

{
  anon_class_1_0_00000001_for_transformer f;
  anon_class_1_0_00000001_for_transformer local_99;
  IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
  local_98;
  
  IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>
  ::IntersectState(&local_98,(AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_> *)this,
                   other,&local_99);
  IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
  ::IEnumerableCore(__return_storage_ptr__,&local_98);
  local_98.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157780;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_98.filter._M_t);
  local_98.source2.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if (local_98.source2.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.source2.state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_98.source1.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157230;
  if (local_98.source1.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.source1.source.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.source1.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.source1.source.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

auto Intersect(O&& other)
		{
			using S2 = typename std::remove_reference<O>::type;
			using TS = typename std::remove_reference<T>::type;
			auto f = [](TS x) { return x; };
			using F = decltype(f);
			return IEnumerableCore<IntersectState<S, S2, F, TS>>(IntersectState<S, S2, F, TS>(std::move(source), std::move(other), f));
		}